

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int vm_builtin_rand(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint uVar1;
  uint uVar2;
  sxu32 iDiv;
  sxu32 iMax;
  sxu32 iMin;
  sxu32 iNum;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  iMax = jx9VmRandomNum(pCtx->pVm);
  if (1 < nArg) {
    uVar1 = jx9_value_to_int(*apArg);
    uVar2 = jx9_value_to_int(apArg[1]);
    if (uVar1 < uVar2) {
      uVar2 = (uVar2 + 1) - uVar1;
      if (uVar2 != 0) {
        iMax = iMax % uVar2 + uVar1;
      }
    }
    else if (uVar2 != 0) {
      iMax = iMax % uVar2;
    }
  }
  jx9_result_int64(pCtx,(ulong)iMax);
  return 0;
}

Assistant:

static int vm_builtin_rand(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	sxu32 iNum;
	/* Generate the random number */
	iNum = jx9VmRandomNum(pCtx->pVm);
	if( nArg > 1 ){
		sxu32 iMin, iMax;
		iMin = (sxu32)jx9_value_to_int(apArg[0]);
		iMax = (sxu32)jx9_value_to_int(apArg[1]);
		if( iMin < iMax ){
			sxu32 iDiv = iMax+1-iMin;
			if( iDiv > 0 ){
				iNum = (iNum % iDiv)+iMin;
			}
		}else if(iMax > 0 ){
			iNum %= iMax;
		}
	}
	/* Return the number */
	jx9_result_int64(pCtx, (jx9_int64)iNum);
	return SXRET_OK;
}